

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_multisampled_render_to_single_sampled
          (Impl *this,Value *state,VkMultisampledRenderToSingleSampledInfoEXT **out_info)

{
  uint uVar1;
  VkSampleCountFlagBits VVar2;
  VkMultisampledRenderToSingleSampledInfoEXT *pVVar3;
  Type pGVar4;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkMultisampledRenderToSingleSampledInfoEXT>
                     (&this->allocator);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"multisampledRenderToSingleSampledEnable");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->multisampledRenderToSingleSampledEnable = uVar1;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"rasterizationSamples");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->rasterizationSamples = VVar2;
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_multisampled_render_to_single_sampled(const Value &state, VkMultisampledRenderToSingleSampledInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkMultisampledRenderToSingleSampledInfoEXT>();
	info->multisampledRenderToSingleSampledEnable = state["multisampledRenderToSingleSampledEnable"].GetUint();
	info->rasterizationSamples = static_cast<VkSampleCountFlagBits>(state["rasterizationSamples"].GetUint());
	*out_info = info;
	return true;
}